

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilter.cpp
# Opt level: O0

SimpleString __thiscall TestFilter::asString(TestFilter *this)

{
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  long in_RSI;
  char *in_RDI;
  SimpleString SVar3;
  SimpleString *textFilter;
  char *in_stack_ffffffffffffffd8;
  SimpleString *in_stack_ffffffffffffffe0;
  size_t sVar2;
  
  pcVar1 = SimpleString::asCharString((SimpleString *)0x129dcf);
  SVar3 = StringFromFormat(in_RDI,"TestFilter: \"%s\"",pcVar1);
  sVar2 = SVar3.bufferSize_;
  if (((*(byte *)(in_RSI + 0x10) & 1) == 0) || ((*(byte *)(in_RSI + 0x11) & 1) == 0)) {
    if ((*(byte *)(in_RSI + 0x10) & 1) == 0) {
      if ((*(byte *)(in_RSI + 0x11) & 1) != 0) {
        SimpleString::operator+=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        sVar2 = extraout_RDX_01;
      }
    }
    else {
      SimpleString::operator+=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      sVar2 = extraout_RDX_00;
    }
  }
  else {
    SimpleString::operator+=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    sVar2 = extraout_RDX;
  }
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = in_RDI;
  return SVar3;
}

Assistant:

SimpleString TestFilter::asString() const
{
    SimpleString textFilter =  StringFromFormat("TestFilter: \"%s\"", filter_.asCharString());
    if (strictMatching_ && invertMatching_)
        textFilter += " with strict, invert matching";
    else if (strictMatching_)
        textFilter += " with strict matching";
    else if (invertMatching_)
        textFilter += " with invert matching";

    return textFilter;
}